

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tipc_connecter.cpp
# Opt level: O0

void __thiscall zmq::tipc_connecter_t::start_connecting(tipc_connecter_t *this)

{
  int iVar1;
  handle_t pvVar2;
  int *piVar3;
  int in_EDX;
  int __fd;
  char *in_RSI;
  socket_base_t *in_RDI;
  int rc;
  undefined8 in_stack_ffffffffffffff78;
  fd_t fd_;
  array_item_t<0> *handle_;
  io_object_t *in_stack_ffffffffffffff80;
  socket_base_t *this_00;
  undefined4 in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffffb8;
  tipc_connecter_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff0;
  
  fd_ = (fd_t)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  iVar1 = open((tipc_connecter_t *)in_RDI,in_RSI,in_EDX);
  __fd = (int)in_RSI;
  if (iVar1 == 0) {
    pvVar2 = io_object_t::add_fd(in_stack_ffffffffffffff80,fd_);
    (in_RDI->_sync)._mutex.__align = (long)pvVar2;
    out_event(in_stack_ffffffffffffffc0);
  }
  else if ((iVar1 == -1) && (piVar3 = __errno_location(), *piVar3 == 0x73)) {
    handle_ = &in_RDI->super_array_item_t<0>;
    pvVar2 = io_object_t::add_fd(in_stack_ffffffffffffff80,(fd_t)((ulong)handle_ >> 0x20));
    (in_RDI->_sync)._mutex.__align = (long)pvVar2;
    io_object_t::set_pollout(in_stack_ffffffffffffff80,handle_);
    this_00 = *(socket_base_t **)&(in_RDI->_sync)._attr;
    make_unconnected_connect_endpoint_pair(in_stack_ffffffffffffffb8);
    iVar1 = zmq_errno();
    socket_base_t::event_connect_delayed
              (in_RDI,(endpoint_uri_pair_t *)CONCAT44(iVar1,in_stack_ffffffffffffff88),
               (int)((ulong)this_00 >> 0x20));
    endpoint_uri_pair_t::~endpoint_uri_pair_t((endpoint_uri_pair_t *)this_00);
  }
  else {
    if (*(int *)&(in_RDI->super_i_pipe_events)._vptr_i_pipe_events != -1) {
      stream_connecter_base_t::close((stream_connecter_base_t *)in_RDI,__fd);
    }
    stream_connecter_base_t::add_reconnect_timer
              ((stream_connecter_base_t *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void zmq::tipc_connecter_t::start_connecting ()
{
    //  Open the connecting socket.
    int rc = open ();

    //  Connect may succeed in synchronous manner.
    if (rc == 0) {
        _handle = add_fd (_s);
        out_event ();
    }

    //  Connection establishment may be delayed. Poll for its completion.
    else if (rc == -1 && errno == EINPROGRESS) {
        _handle = add_fd (_s);
        set_pollout (_handle);
        _socket->event_connect_delayed (
          make_unconnected_connect_endpoint_pair (_endpoint), zmq_errno ());
    }

    //  Handle any other error condition by eventual reconnect.
    else {
        if (_s != retired_fd)
            close ();
        add_reconnect_timer ();
    }
}